

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O2

_List_iterator<Diligent::Parsing::HLSLTokenInfo>
Diligent::Parsing::FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
          (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *Start,
          _List_iterator<Diligent::Parsing::HLSLTokenInfo> *End,
          _List_iterator<Diligent::Parsing::HLSLTokenInfo> Pos)

{
  bool bVar1;
  int iVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  TokenType OpenBracketType;
  anon_class_24_3_5ed64ae7 UpdateBracketCount;
  int BracketCount;
  HLSLTokenType local_50;
  TokenType local_4c;
  string local_48;
  int local_24;
  
  p_Var3 = End->_M_node;
  if (p_Var3 == Pos._M_node) {
    return (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)Pos._M_node;
  }
  local_4c = *(TokenType *)&Pos._M_node[1]._M_next;
  switch(local_4c) {
  case OpenBrace:
    local_50 = ClosingBrace;
    break;
  case ClosingBrace:
    local_50 = OpenBrace;
    goto LAB_001d1e0b;
  case OpenParen:
    local_50 = ClosingParen;
    break;
  case ClosingParen:
    local_50 = OpenParen;
    goto LAB_001d1e0b;
  case OpenSquareBracket:
    local_50 = ClosingSquareBracket;
    break;
  case ClosingSquareBracket:
    local_50 = OpenSquareBracket;
    goto LAB_001d1e0b;
  case OpenAngleBracket:
    local_50 = ClosingAngleBracket;
    break;
  case ClosingAngleBracket:
    local_50 = OpenAngleBracket;
LAB_001d1e0b:
    Pos._M_node = (_List_node_base *)&(Pos._M_node)->_M_prev;
    bVar1 = false;
    goto LAB_001d1e1d;
  default:
    FormatString<char[37]>(&local_48,(char (*) [37])"One of the bracket types is expected");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"FindMatchingBracket",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
               ,0x3c5);
    std::__cxx11::string::~string((string *)&local_48);
    return (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)Pos._M_node;
  }
  bVar1 = true;
LAB_001d1e1d:
  p_Var4 = (Pos._M_node)->_M_next;
  local_48._M_string_length = (size_type)&local_24;
  local_24 = 1;
  local_48._M_dataplus._M_p = (pointer)&local_4c;
  local_48.field_2._M_allocated_capacity = (size_type)&local_50;
  if (bVar1) {
    while ((p_Var4 != p_Var3 &&
           (iVar2 = FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>::
                    anon_class_24_3_5ed64ae7::operator()
                              ((anon_class_24_3_5ed64ae7 *)&local_48,
                               *(TokenType *)&p_Var4[1]._M_next), p_Var3 = p_Var4, iVar2 != 0))) {
      p_Var4 = p_Var4->_M_next;
      p_Var3 = End->_M_node;
    }
  }
  else {
    while ((p_Var4 != Start->_M_node &&
           (iVar2 = FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>::
                    anon_class_24_3_5ed64ae7::operator()
                              ((anon_class_24_3_5ed64ae7 *)&local_48,
                               *(TokenType *)&p_Var4[1]._M_next), p_Var3 = p_Var4, iVar2 != 0))) {
      p_Var4 = p_Var4->_M_prev;
      p_Var3 = End->_M_node;
    }
  }
  return (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)p_Var3;
}

Assistant:

TokenIterType FindMatchingBracket(const TokenIterType& Start,
                                  const TokenIterType& End,
                                  TokenIterType        Pos)
{
    if (Pos == End)
        return Pos;

    const auto OpenBracketType = Pos->GetType();
    using TokenType            = decltype(OpenBracketType);

    auto ClosingBracketType = TokenType::Undefined;
    bool SearchForward      = true;
    switch (OpenBracketType)
    {
        case TokenType::OpenBrace:
            ClosingBracketType = TokenType::ClosingBrace;
            break;

        case TokenType::OpenParen:
            ClosingBracketType = TokenType::ClosingParen;
            break;

        case TokenType::OpenSquareBracket:
            ClosingBracketType = TokenType::ClosingSquareBracket;
            break;

        case TokenType::OpenAngleBracket:
            ClosingBracketType = TokenType::ClosingAngleBracket;
            break;

        case TokenType::ClosingBrace:
            ClosingBracketType = TokenType::OpenBrace;
            SearchForward      = false;
            break;

        case TokenType::ClosingParen:
            ClosingBracketType = TokenType::OpenParen;
            SearchForward      = false;
            break;

        case TokenType::ClosingSquareBracket:
            ClosingBracketType = TokenType::OpenSquareBracket;
            SearchForward      = false;
            break;

        case TokenType::ClosingAngleBracket:
            ClosingBracketType = TokenType::OpenAngleBracket;
            SearchForward      = false;
            break;

        default:
            UNEXPECTED("One of the bracket types is expected");
            return Pos;
    }

    (SearchForward ? ++Pos : --Pos); // Skip open bracket
    int BracketCount = 1;

    auto UpdateBracketCount = [&](TokenType Type) //
    {
        if (Type == OpenBracketType)
            ++BracketCount;
        else if (Type == ClosingBracketType)
        {
            --BracketCount;
        }
        return BracketCount;
    };
    if (SearchForward)
    {
        while (Pos != End)
        {
            if (UpdateBracketCount(Pos->GetType()) == 0)
                return Pos;
            ++Pos;
        }
    }
    else
    {
        while (Pos != Start)
        {
            if (UpdateBracketCount(Pos->GetType()) == 0)
                return Pos;
            --Pos;
        }
    }
    return End;
}